

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

string * __thiscall
glcts::ArraysOfArrays::InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::
prepare_geometry_shader
          (string *__return_storage_ptr__,
          InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type,string *uniform_definition,string *uniform_use)

{
  TestError *this_00;
  string *uniform_use_local;
  string *uniform_definition_local;
  TestShaderType tested_shader_type_local;
  InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL> *this_local;
  string *geometry_shader_source;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (COMPUTE_SHADER_TYPE < tested_shader_type) {
    if (tested_shader_type == GEOMETRY_SHADER_TYPE) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 "layout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nout float fs_result;\n\n"
                );
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)uniform_definition);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)shader_start_abi_cxx11_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)uniform_use);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,
                 "\n    gl_Position  = vec4(-1, -1, 0, 1);\n    fs_result    = result;\n    EmitVertex();\n    gl_Position  = vec4(-1, 1, 0, 1);\n    fs_result    = result;\n    EmitVertex();\n    gl_Position  = vec4(1, -1, 0, 1);\n    fs_result    = result;\n    EmitVertex();\n    gl_Position  = vec4(1, 1, 0, 1);\n    fs_result    = result;\n    EmitVertex();\n}\n"
                );
    }
    else {
      if (1 < tested_shader_type - TESSELATION_CONTROL_SHADER_TYPE) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized shader object type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x193d);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 "layout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nin  float tes_result[];\nout float fs_result;\n\nvoid main()\n{\n    gl_Position  = vec4(-1, -1, 0, 1);\n    fs_result    = tes_result[0];\n    EmitVertex();\n    gl_Position  = vec4(-1, 1, 0, 1);\n    fs_result    = tes_result[0];\n    EmitVertex();\n    gl_Position  = vec4(1, -1, 0, 1);\n    fs_result    = tes_result[0];\n    EmitVertex();\n    gl_Position  = vec4(1, 1, 0, 1);\n    fs_result    = tes_result[0];\n    EmitVertex();\n}\n"
                );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InteractionUniforms1<API>::prepare_geometry_shader(
	typename TestCaseBase<API>::TestShaderType tested_shader_type, const std::string& uniform_definition,
	const std::string& uniform_use)
{
	std::string geometry_shader_source;

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		break;

	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		geometry_shader_source = "layout(points)                           in;\n"
								 "layout(triangle_strip, max_vertices = 4) out;\n"
								 "\n"
								 "in  float tes_result[];\n"
								 "out float fs_result;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    gl_Position  = vec4(-1, -1, 0, 1);\n"
								 "    fs_result    = tes_result[0];\n"
								 "    EmitVertex();\n"
								 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
								 "    fs_result    = tes_result[0];\n"
								 "    EmitVertex();\n"
								 "    gl_Position  = vec4(1, -1, 0, 1);\n"
								 "    fs_result    = tes_result[0];\n"
								 "    EmitVertex();\n"
								 "    gl_Position  = vec4(1, 1, 0, 1);\n"
								 "    fs_result    = tes_result[0];\n"
								 "    EmitVertex();\n"
								 "}\n";
		break;

	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		geometry_shader_source = "layout(points)                           in;\n"
								 "layout(triangle_strip, max_vertices = 4) out;\n"
								 "\n"
								 "out float fs_result;\n"
								 "\n";

		/* User-defined function definition. */
		geometry_shader_source += uniform_definition;
		geometry_shader_source += "\n\n";

		/* Main function definition. */
		geometry_shader_source += shader_start;
		geometry_shader_source += uniform_use;
		geometry_shader_source += "\n\n";
		geometry_shader_source += "\n    gl_Position  = vec4(-1, -1, 0, 1);\n"
								  "    fs_result    = result;\n"
								  "    EmitVertex();\n"
								  "    gl_Position  = vec4(-1, 1, 0, 1);\n"
								  "    fs_result    = result;\n"
								  "    EmitVertex();\n"
								  "    gl_Position  = vec4(1, -1, 0, 1);\n"
								  "    fs_result    = result;\n"
								  "    EmitVertex();\n"
								  "    gl_Position  = vec4(1, 1, 0, 1);\n"
								  "    fs_result    = result;\n"
								  "    EmitVertex();\n"
								  "}\n";
		break;

	default:
		TCU_FAIL("Unrecognized shader object type.");
		break;
	}

	return geometry_shader_source;
}